

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O1

void __thiscall QWidgetItem::setGeometry(QWidgetItem *this,QRect *rect)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Representation RVar5;
  QSizePolicy QVar6;
  int iVar7;
  int iVar8;
  LayoutDirection direction;
  Alignment AVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int extraout_var;
  int extraout_var_00;
  QSize QVar13;
  int extraout_var_01;
  int iVar14;
  int iVar15;
  undefined8 uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long in_FS_OFFSET;
  int local_68;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[8])();
  if ((char)iVar3 == '\0') {
    bVar2 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
    if (bVar2) {
      uVar17._0_4_ = rect->x1;
      uVar17._4_4_ = rect->y1;
      uVar16._0_4_ = rect->x2;
      uVar16._4_4_ = rect->y2;
      uVar11 = uVar17._4_4_;
    }
    else {
      lVar1 = *(long *)&this->wid->field_0x8;
      uVar17 = (ulong)(uint)((int)*(char *)(lVar1 + 0x1a0) + (rect->x1).m_i);
      uVar11 = (int)*(char *)(lVar1 + 0x1a1) + (rect->y1).m_i;
      uVar16 = CONCAT44((rect->y2).m_i - (int)*(char *)(lVar1 + 0x1a3),
                        (rect->x2).m_i - (int)*(char *)(lVar1 + 0x1a2));
    }
    iVar18 = (int)uVar16 + 1;
    uVar10 = (uint)uVar17;
    iVar19 = iVar18 - uVar10;
    iVar15 = (int)((ulong)uVar16 >> 0x20) + 1;
    iVar21 = iVar15 - uVar11;
    iVar14 = ~(rect->x2).m_i + iVar19 + (rect->x1).m_i;
    iVar20 = ~(rect->y2).m_i + iVar21 + (rect->y1).m_i;
    iVar4 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[4])(this);
    iVar3 = iVar4 + iVar14;
    if (iVar19 < iVar4 + iVar14) {
      iVar3 = iVar19;
    }
    iVar4 = extraout_var + iVar20;
    if (iVar21 < extraout_var + iVar20) {
      iVar4 = iVar21;
    }
    iVar8 = iVar4;
    if (((this->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1ff) != 0) {
      RVar5.m_i = (*(this->super_QLayoutItem)._vptr_QLayoutItem[2])(this);
      QVar6 = QWidget::sizePolicy(this->wid);
      if (((uint)QVar6.field_0 & 0xf0000) == 0xd0000) {
        iVar7 = (**(code **)(*(long *)this->wid + 0x70))();
        QVar13 = QWidget::minimumSize(this->wid);
        RVar5.m_i = QVar13.wd.m_i.m_i;
        if (QVar13.wd.m_i.m_i < iVar7) {
          RVar5.m_i = iVar7;
        }
      }
      local_68 = extraout_var_00;
      if (((uint)QVar6.field_0 & 0xf00000) == 0xd00000) {
        (**(code **)(*(long *)this->wid + 0x70))();
        QVar13 = QWidget::minimumSize(this->wid);
        local_68 = (int)QVar13.ht.m_i;
        if (local_68 < extraout_var_01) {
          local_68 = extraout_var_01;
        }
      }
      uVar12 = (this->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i;
      iVar7 = RVar5.m_i + iVar14;
      if (iVar3 < RVar5.m_i + iVar14) {
        iVar7 = iVar3;
      }
      if ((uVar12 & 0x1f) == 0) {
        iVar7 = iVar3;
      }
      iVar3 = iVar7;
      if ((uVar12 & 0x1e0) != 0) {
        iVar8 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[9])(this);
        if ((char)iVar8 == '\0') {
          iVar8 = local_68 + iVar20;
          if (iVar4 < local_68 + iVar20) {
            iVar8 = iVar4;
          }
        }
        else {
          iVar14 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[10])
                             (this,(ulong)(uint)(iVar3 - iVar14));
          iVar8 = iVar14 + iVar20;
          if (iVar4 < iVar14 + iVar20) {
            iVar8 = iVar4;
          }
        }
      }
    }
    direction = QWidget::layoutDirection(this->wid);
    AVar9 = QStyle::visualAlignment
                      (direction,
                       (Alignment)
                       (this->super_QLayoutItem).align.
                       super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i);
    if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 2) == 0) {
      if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 1) == 0) {
        uVar10 = (iVar19 - iVar3) / 2 + uVar10;
      }
    }
    else {
      uVar10 = iVar18 - iVar3;
    }
    uVar12 = (this->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i;
    if ((uVar12 & 0x40) == 0) {
      if ((uVar12 & 0x20) == 0) {
        uVar11 = (iVar21 - iVar8) / 2 + uVar11;
      }
    }
    else {
      uVar11 = iVar15 - iVar8;
    }
    uVar12 = (int)uVar10 >> 0x1f & uVar10;
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    local_48.y1.m_i = 0;
    if (0 < (int)uVar11) {
      local_48.y1.m_i = uVar11;
    }
    local_48.x2.m_i = uVar12 + iVar3 + uVar10 + -1;
    local_48.y2.m_i = ((int)uVar11 >> 0x1f & uVar11) + iVar8 + local_48.y1.m_i + -1;
    local_48.x1.m_i = uVar10;
    QWidget::setGeometry(this->wid,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetItem::setGeometry(const QRect &rect)
{
    if (isEmpty())
        return;

    QRect r = !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
            ? fromLayoutItemRect(wid->d_func(), rect)
            : rect;
    const QSize widgetRectSurplus = r.size() - rect.size();

    /*
       For historical reasons, this code is done using widget rect
       coordinates, not layout item rect coordinates. However,
       QWidgetItem's sizeHint(), maximumSize(), and heightForWidth()
       all work in terms of layout item rect coordinates, so we have to
       add or subtract widgetRectSurplus here and there. The code could
       be much simpler if we did everything using layout item rect
       coordinates and did the conversion right before the call to
       QWidget::setGeometry().
     */

    QSize s = r.size().boundedTo(maximumSize() + widgetRectSurplus);
    int x = r.x();
    int y = r.y();
    if (align & (Qt::AlignHorizontal_Mask | Qt::AlignVertical_Mask)) {
        QSize pref(sizeHint());
        QSizePolicy sp = wid->sizePolicy();
        if (sp.horizontalPolicy() == QSizePolicy::Ignored)
            pref.setWidth(wid->sizeHint().expandedTo(wid->minimumSize()).width());
        if (sp.verticalPolicy() == QSizePolicy::Ignored)
            pref.setHeight(wid->sizeHint().expandedTo(wid->minimumSize()).height());
        pref += widgetRectSurplus;
        if (align & Qt::AlignHorizontal_Mask)
            s.setWidth(qMin(s.width(), pref.width()));
        if (align & Qt::AlignVertical_Mask) {
            if (hasHeightForWidth())
                s.setHeight(qMin(s.height(),
                                 heightForWidth(s.width() - widgetRectSurplus.width())
                                 + widgetRectSurplus.height()));
            else
                s.setHeight(qMin(s.height(), pref.height()));
        }
    }
    Qt::Alignment alignHoriz = QStyle::visualAlignment(wid->layoutDirection(), align);
    if (alignHoriz & Qt::AlignRight)
        x = x + (r.width() - s.width());
    else if (!(alignHoriz & Qt::AlignLeft))
        x = x + (r.width() - s.width()) / 2;

    if (align & Qt::AlignBottom)
        y = y + (r.height() - s.height());
    else if (!(align & Qt::AlignTop))
        y = y + (r.height() - s.height()) / 2;

    // Make sure we don't move outside of the parent, e.g when styles demand
    // surplus space that exceeds the available margins (f.ex macOS with QGroupBox)
    if (x < 0) {
        s.rwidth() += x;
        x = 0;
    }
    if (y < 0) {
        s.rheight() += y;
        y = 0;
    }

    wid->setGeometry(x, y, s.width(), s.height());
}